

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.h
# Opt level: O0

void __thiscall llvm::APFloat::makeNaN(APFloat *this,bool SNaN,bool Neg,APInt *fill)

{
  bool bVar1;
  fltSemantics *pfVar2;
  APInt *fill_local;
  bool Neg_local;
  bool SNaN_local;
  APFloat *this_local;
  
  pfVar2 = getSemantics(this);
  bVar1 = usesLayout<llvm::detail::IEEEFloat>(pfVar2);
  if (bVar1) {
    detail::IEEEFloat::makeNaN(&(this->U).IEEE,SNaN,Neg,fill);
  }
  else {
    pfVar2 = getSemantics(this);
    bVar1 = usesLayout<llvm::detail::DoubleAPFloat>(pfVar2);
    if (!bVar1) {
      llvm_unreachable_internal
                ("Unexpected semantics",
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/APFloat.h"
                 ,799);
    }
    detail::DoubleAPFloat::makeNaN((DoubleAPFloat *)&(this->U).IEEE,SNaN,Neg,fill);
  }
  return;
}

Assistant:

void makeNaN(bool SNaN, bool Neg, const APInt *fill) {
    APFLOAT_DISPATCH_ON_SEMANTICS(makeNaN(SNaN, Neg, fill));
  }